

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char,char(&)[46],char_const(&)[3],unsigned_short>
          (String *__return_storage_ptr__,kj *this,char *params,char (*params_1) [46],
          char (*params_2) [3],unsigned_short *params_3)

{
  char *value;
  char (*value_00) [46];
  char (*value_01) [3];
  unsigned_short *value_02;
  CappedArray<char,_8UL> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  _ local_31;
  char (*local_30) [3];
  unsigned_short *params_local_3;
  char (*params_local_2) [3];
  char (*params_local_1) [46];
  char *params_local;
  
  local_30 = params_2;
  params_local_3 = (unsigned_short *)params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (char (*) [46])this;
  params_local = (char *)__return_storage_ptr__;
  value = fwd<char>((NoInfer<char> *)this);
  local_31 = (_)toCharSequence<char>(value);
  value_00 = char((char (*) [46])params_local_2);
  local_48 = toCharSequence<char(&)[46]>(value_00);
  value_01 = ::const((char (*) [3])params_local_3);
  local_58 = toCharSequence<char_const(&)[3]>(value_01);
  value_02 = fwd<unsigned_short>((NoInfer<unsigned_short> *)local_30);
  local_68 = toCharSequence<unsigned_short>(value_02);
  _::
  concat<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>>
            (__return_storage_ptr__,&local_31,(FixedArray<char,_1UL> *)&local_48,&local_58,
             (ArrayPtr<const_char> *)&local_68,(CappedArray<char,_8UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}